

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qibusproxy.cpp
# Opt level: O2

void QIBusProxy::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QString method;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  QDBusPendingReply<QDBusVariant> _r;
  undefined8 in_stack_fffffffffffffe18;
  QDBusPendingReplyBase QVar3;
  char16_t *in_stack_fffffffffffffe28;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if ((_id == 3) || (_id == 4)) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType;
        goto switchD_00117e54_default;
      }
    }
    else {
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
    goto switchD_00117e54_default;
  }
  if (_c == IndexOfMethod) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QtMocHelpers::indexOfMethod<void(QIBusProxy::*)(QString_const&)>
                ((QtMocHelpers *)_a,(void **)GlobalEngineChanged,0,0);
      return;
    }
    goto LAB_001180b9;
  }
  if (_c != InvokeMetaMethod) goto switchD_00117e54_default;
  switch(_id) {
  case 0:
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      GlobalEngineChanged((QIBusProxy *)_o,(QString *)_a[1]);
      return;
    }
    goto LAB_001180b9;
  case 1:
    CreateInputContext((QDBusPendingReply<QDBusObjectPath> *)&stack0xfffffffffffffe20,
                       (QIBusProxy *)_o,(QString *)_a[1]);
    if ((QDBusPendingReply<QDBusObjectPath> *)*_a != (QDBusPendingReply<QDBusObjectPath> *)0x0) {
      QDBusPendingReply<QDBusObjectPath>::assign
                ((QDBusPendingReply<QDBusObjectPath> *)*_a,
                 (QDBusPendingCall *)&stack0xfffffffffffffe20);
    }
    goto LAB_00117fca;
  case 2:
    Exit((QDBusPendingReply<> *)&stack0xfffffffffffffe20,(QIBusProxy *)_o,*_a[1]);
    goto LAB_00117fb8;
  case 3:
    Ping((QDBusPendingReply<QDBusVariant> *)&stack0xfffffffffffffe20,(QIBusProxy *)_o,
         (QDBusVariant *)_a[1]);
    if ((QDBusPendingReply<QDBusVariant> *)*_a != (QDBusPendingReply<QDBusVariant> *)0x0) {
      QDBusPendingReply<QDBusVariant>::assign
                ((QDBusPendingReply<QDBusVariant> *)*_a,(QDBusPendingCall *)&stack0xfffffffffffffe20
                );
    }
    goto LAB_00117fca;
  case 4:
    RegisterComponent((QDBusPendingReply<> *)&stack0xfffffffffffffe20,(QIBusProxy *)_o,
                      (QDBusVariant *)_a[1]);
LAB_00117fb8:
    if ((QDBusPendingReply<> *)*_a != (QDBusPendingReply<> *)0x0) {
      QDBusPendingReply<>::assign
                ((QDBusPendingReply<> *)*_a,(QDBusPendingCall *)&stack0xfffffffffffffe20);
    }
LAB_00117fca:
    QDBusPendingReplyBase::~QDBusPendingReplyBase((QDBusPendingReplyBase *)&stack0xfffffffffffffe20)
    ;
    break;
  case 5:
    QVar3 = (QDBusPendingReplyBase)0xaaaaaaaaaaaaaaaa;
    plVar1 = (long *)_a[1];
    local_38.d = (Data *)*plVar1;
    local_38.ptr = (char16_t *)plVar1[1];
    local_38.size = plVar1[2];
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    method.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    method.d.d = (Data *)in_stack_fffffffffffffe18;
    method.d.size = (qsizetype)in_stack_fffffffffffffe28;
    GetProperty((QIBusProxy *)&stack0xfffffffffffffe20,method);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    goto LAB_00118037;
  case 6:
    QVar3 = (QDBusPendingReplyBase)0xaaaaaaaaaaaaaaaa;
    GlobalEngine((QIBusProxy *)&stack0xfffffffffffffe20);
LAB_00118037:
    if ((QDBusPendingReplyBase *)*_a != (QDBusPendingReplyBase *)0x0) {
      *(QDBusPendingReplyBase *)*_a = QVar3;
    }
    QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)&stack0xfffffffffffffe20);
    break;
  case 7:
    memset((QIBusEngineDesc *)&stack0xfffffffffffffe20,0xaa,0x1a8);
    getGlobalEngine((QIBusEngineDesc *)&stack0xfffffffffffffe20,(QIBusProxy *)_o);
    if ((QIBusEngineDesc *)*_a != (QIBusEngineDesc *)0x0) {
      QIBusEngineDesc::operator=((QIBusEngineDesc *)*_a,(QIBusEngineDesc *)&stack0xfffffffffffffe20)
      ;
    }
    QIBusEngineDesc::~QIBusEngineDesc((QIBusEngineDesc *)&stack0xfffffffffffffe20);
  }
switchD_00117e54_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_001180b9:
  __stack_chk_fail();
}

Assistant:

void QIBusProxy::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QIBusProxy *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->GlobalEngineChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: { QDBusPendingReply<QDBusObjectPath> _r = _t->CreateInputContext((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QDBusObjectPath>*>(_a[0]) = std::move(_r); }  break;
        case 2: { QDBusPendingReply<> _r = _t->Exit((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<QDBusVariant> _r = _t->Ping((*reinterpret_cast< std::add_pointer_t<QDBusVariant>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QDBusVariant>*>(_a[0]) = std::move(_r); }  break;
        case 4: { QDBusPendingReply<> _r = _t->RegisterComponent((*reinterpret_cast< std::add_pointer_t<QDBusVariant>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 5: { QDBusPendingCall _r = _t->GetProperty((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingCall*>(_a[0]) = std::move(_r); }  break;
        case 6: { QDBusPendingCall _r = _t->GlobalEngine();
            if (_a[0]) *reinterpret_cast< QDBusPendingCall*>(_a[0]) = std::move(_r); }  break;
        case 7: { QIBusEngineDesc _r = _t->getGlobalEngine();
            if (_a[0]) *reinterpret_cast< QIBusEngineDesc*>(_a[0]) = std::move(_r); }  break;
        case 8: _t->globalEngineChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusVariant >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusVariant >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QIBusProxy::*)(const QString & )>(_a, &QIBusProxy::GlobalEngineChanged, 0))
            return;
    }
}